

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature,cmListFileContext *lfc)

{
  bool bVar1;
  reference pvVar2;
  pair<cmTarget::TLLSignature,_cmListFileContext> local_78;
  byte local_21;
  cmListFileContext *pcStack_20;
  bool ret;
  cmListFileContext *lfc_local;
  cmTarget *pcStack_10;
  TLLSignature signature_local;
  cmTarget *this_local;
  
  local_21 = 1;
  pcStack_20 = lfc;
  lfc_local._4_4_ = signature;
  pcStack_10 = this;
  bVar1 = std::
          vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
          ::empty(&this->TLLCommands);
  if ((!bVar1) &&
     (pvVar2 = std::
               vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
               ::back(&this->TLLCommands), pvVar2->first != lfc_local._4_4_)) {
    local_21 = 0;
  }
  bVar1 = std::
          vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
          ::empty(&this->TLLCommands);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
             ::back(&this->TLLCommands);
    bVar1 = ::operator!=(&pvVar2->second,pcStack_20);
    if (!bVar1) goto LAB_005646e8;
  }
  std::make_pair<cmTarget::TLLSignature&,cmListFileContext_const&>
            (&local_78,(TLLSignature *)((long)&lfc_local + 4),pcStack_20);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::push_back(&this->TLLCommands,&local_78);
  std::pair<cmTarget::TLLSignature,_cmListFileContext>::~pair(&local_78);
LAB_005646e8:
  return (bool)(local_21 & 1);
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature,
                                   cmListFileContext const& lfc)
{
  bool ret = true;
  if (!this->TLLCommands.empty()) {
    if (this->TLLCommands.back().first != signature) {
      ret = false;
    }
  }
  if (this->TLLCommands.empty() || this->TLLCommands.back().second != lfc) {
    this->TLLCommands.push_back(std::make_pair(signature, lfc));
  }
  return ret;
}